

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O2

nh_bool set_command_keys(win_menu *mdat,wchar_t idx)

{
  byte *pbVar1;
  nh_menuitem_conflict *pnVar2;
  char cVar3;
  char *pcVar4;
  nh_cmd_desc *pnVar5;
  nh_menuitem_conflict *items;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t icount;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  wchar_t local_13c;
  wchar_t count;
  
  wVar6 = mdat->items[idx].id;
  if ((ulong)(uint)wVar6 == 0xffffd8f0) {
    count = L'\0';
    init_keymap();
    pcVar4 = (char *)nh_get_commands(&count);
    uVar8 = 0;
    if (L'\0' < count) {
      uVar8 = (ulong)(uint)count;
    }
    while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
      pnVar5 = find_command(pcVar4);
      if (pnVar5 != (nh_cmd_desc *)0x0) {
        pnVar5->flags = *(uint *)(pcVar4 + 0x68);
      }
      pcVar4 = pcVar4 + 0x6c;
    }
    return '\x01';
  }
  pnVar5 = commandlist + ((ulong)(uint)wVar6 - 1);
  if (wVar6 < L'\0') {
    pnVar5 = builtin_commands + (uint)~wVar6;
  }
  items = (nh_menuitem_conflict *)malloc(0xa78);
  wVar6 = L'\n';
LAB_0010b57f:
  do {
    lVar9 = 0;
    uVar8 = 0;
    do {
      do {
        do {
          for (; wVar7 = (wchar_t)uVar8, lVar9 != 0x1ff; lVar9 = lVar9 + 1) {
            if (keymap[lVar9] == pnVar5) {
              pcVar4 = curses_keyname((wchar_t)lVar9);
              sprintf((char *)&count,"delete key %s",pcVar4);
              if (wVar6 <= wVar7) {
                wVar6 = wVar6 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar6 * 0x10c);
              }
              pnVar2 = items + wVar7;
              pnVar2->id = (wchar_t)lVar9;
              pnVar2->role = MI_NORMAL;
              pnVar2->accel = '\0';
              pnVar2->group_accel = '\0';
              pnVar2->selected = '\0';
              strcpy(pnVar2->caption,(char *)&count);
              uVar8 = (ulong)(uint)(wVar7 + L'\x01');
            }
          }
          if (L'\0' < wVar7) {
            if (wVar6 <= wVar7) {
              wVar6 = wVar6 * 2;
              items = (nh_menuitem_conflict *)realloc(items,(long)wVar6 * 0x10c);
            }
            items[uVar8].id = L'\0';
            items[uVar8].role = MI_NORMAL;
            items[uVar8].accel = '\0';
            items[uVar8].group_accel = '\0';
            items[uVar8].selected = '\0';
            items[uVar8].caption[0] = '\0';
            wVar7 = wVar7 + L'\x01';
          }
          if (wVar6 <= wVar7) {
            wVar6 = wVar6 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)wVar6 * 0x10c);
          }
          items[wVar7].id = L'\xffffffff';
          items[wVar7].role = MI_NORMAL;
          items[wVar7].accel = '+';
          items[wVar7].group_accel = '\0';
          items[wVar7].selected = '\0';
          builtin_strncpy(items[wVar7].caption,"Add a ne",8);
          builtin_strncpy(items[wVar7].caption + 6,"new key",8);
          icount = wVar7 + L'\x01';
          if (-1 < (int)pnVar5->flags) {
            if ((pnVar5->flags >> 10 & 1) == 0) {
              if (wVar6 <= icount) {
                wVar6 = wVar6 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar6 * 0x10c);
              }
              items[icount].id = L'\xfffffffe';
              items[icount].role = MI_NORMAL;
              items[icount].accel = '\0';
              items[icount].group_accel = '\0';
              items[icount].selected = '\0';
              builtin_strncpy(items[icount].caption,"Use as an extend",0x10);
              builtin_strncpy(items[icount].caption + 0xb,"xtended command",0x10);
            }
            else {
              if (wVar6 <= icount) {
                wVar6 = wVar6 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar6 * 0x10c);
              }
              items[icount].id = L'\xfffffffe';
              items[icount].role = MI_NORMAL;
              items[icount].accel = '\0';
              items[icount].group_accel = '\0';
              items[icount].selected = '\0';
              builtin_strncpy(items[icount].caption,"Don\'t use as an ",0x10);
              builtin_strncpy(items[icount].caption + 0x10,"extended command",0x10);
              items[icount].caption[0x20] = '\0';
            }
            icount = wVar7 + L'\x02';
          }
          sprintf((char *)&count,"Key bindings for %s",pnVar5);
          wVar7 = curses_display_menu(items,icount,(char *)&count,L'\x01',&local_13c);
          if (wVar7 < L'\x01') {
            free(items);
            return '\x01';
          }
          if (0 < (long)local_13c) {
            keymap[local_13c] = (nh_cmd_desc *)0x0;
            goto LAB_0010b57f;
          }
          if (local_13c == L'\xfffffffe') {
            pbVar1 = (byte *)((long)&pnVar5->flags + 1);
            *pbVar1 = *pbVar1 ^ 4;
            goto LAB_0010b57f;
          }
          lVar9 = 0;
          uVar8 = 0;
        } while (local_13c != L'\xffffffff');
        lVar9 = 0;
        sprintf((char *)&count,"Press the key you want to use for \"%s\"",pnVar5);
        wVar7 = curses_msgwin((char *)&count);
        uVar8 = 0;
      } while (0x1fe < (uint)wVar7 || wVar7 == L'\x1b');
      if (keymap[(uint)wVar7] == (nh_cmd_desc *)0x0) break;
      lVar9 = 0;
      sprintf((char *)&count,"That key is already in use by \"%s\"! Replace?");
      cVar3 = curses_yn_function((char *)&count,"yn",'n');
      uVar8 = 0;
    } while (cVar3 != 'y');
    keymap[(uint)wVar7] = pnVar5;
  } while( true );
}

Assistant:

static nh_bool set_command_keys(struct win_menu *mdat, int idx)
{
    int id = mdat->items[idx].id;
    struct nh_cmd_desc *cmd, *cmdlist;
    
    if (id == RESET_BINDINGS_ID) {
	int i, count = 0;
	init_keymap(); /* fully reset the keymap */
	
	/* reset extcmds */
	cmdlist = nh_get_commands(&count);
	for (i = 0; i < count; i++) {
	    cmd = find_command(cmdlist[i].name);
	    if (cmd)
		cmd->flags = cmdlist[i].flags;
	}
	
	return TRUE;
    }
    
    if (id < 0)
	cmd = &builtin_commands[-(id+1)];
    else
	cmd = &commandlist[id-1];
    
    command_settings_menu(cmd);
    
    return TRUE;
}